

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

void __thiscall ON_Triangle::ON_Triangle(ON_Triangle *this,double *vertices)

{
  double *local_78;
  double *local_70;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  ON_3dPoint local_30;
  double *local_18;
  double *vertices_local;
  ON_Triangle *this_local;
  
  local_18 = vertices;
  vertices_local = (double *)this;
  ON_3dPoint::ON_3dPoint(&local_30,vertices);
  this->m_V[0].x = local_30.x;
  this->m_V[0].y = local_30.y;
  this->m_V[0].z = local_30.z;
  if (local_18 == (double *)0x0) {
    local_70 = local_18;
  }
  else {
    local_70 = local_18 + 3;
  }
  ON_3dPoint::ON_3dPoint(&local_48,local_70);
  this->m_V[1].x = local_48.x;
  this->m_V[1].y = local_48.y;
  this->m_V[1].z = local_48.z;
  if (local_18 == (double *)0x0) {
    local_78 = local_18;
  }
  else {
    local_78 = local_18 + 6;
  }
  ON_3dPoint::ON_3dPoint(&local_60,local_78);
  this->m_V[2].x = local_60.x;
  this->m_V[2].y = local_60.y;
  this->m_V[2].z = local_60.z;
  return;
}

Assistant:

ON_Triangle::ON_Triangle(const double vertices[9])
{
  m_V[0] = ON_3dPoint(vertices);
  m_V[1] = ON_3dPoint(vertices ? vertices+3 : vertices);
  m_V[2] = ON_3dPoint(vertices ? vertices+6 : vertices);
}